

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBezierCurve.cpp
# Opt level: O2

int __thiscall
chrono::ChBezierCurveTracker::calcClosestPoint
          (ChBezierCurveTracker *this,ChVector<double> *loc,ChVector<double> *point)

{
  ChBezierCurve *this_00;
  int iVar1;
  double dVar2;
  double dVar3;
  double p_m;
  undefined1 local_98 [16];
  ChVector<double> pt_m;
  ChVector<double> v_1;
  ChVector<double> v;
  
  ChBezierCurve::calcClosestPoint
            (&pt_m,*(ChBezierCurve **)this,loc,*(size_t *)(this + 0x10),(double *)(this + 0x18));
  point->m_data[0] = pt_m.m_data[0];
  point->m_data[1] = pt_m.m_data[1];
  point->m_data[2] = pt_m.m_data[2];
  if (1e-05 <= *(double *)(this + 0x18)) {
    iVar1 = 0;
    if (0.99999 < *(double *)(this + 0x18)) {
      this_00 = *(ChBezierCurve **)this;
      if ((*(long *)(this + 0x10) ==
           ((long)(this_00->m_points).
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this_00->m_points).
                 super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18 + -2) &&
         (this[0x20] != (ChBezierCurveTracker)0x1)) {
        iVar1 = 1;
      }
      else {
        ChBezierCurve::calcClosestPoint(&pt_m,this_00,loc,*(long *)(this + 0x10) + 1,&p_m);
        local_98._8_8_ = pt_m.m_data[1];
        local_98._0_8_ = pt_m.m_data[0];
        v.m_data._0_16_ = vsubpd_avx(local_98,*(undefined1 (*) [16])loc->m_data);
        v.m_data[2] = pt_m.m_data[2] - loc->m_data[2];
        dVar2 = ChVector<double>::Length2(&v);
        v_1.m_data._0_16_ =
             vsubpd_avx(*(undefined1 (*) [16])point->m_data,*(undefined1 (*) [16])loc->m_data);
        v_1.m_data[2] = point->m_data[2] - loc->m_data[2];
        dVar3 = ChVector<double>::Length2(&v_1);
        if (dVar2 < dVar3) {
          *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
          *(double *)(this + 0x18) = p_m;
          point->m_data[0] = (double)local_98._0_8_;
          point->m_data[1] = (double)local_98._8_8_;
          point->m_data[2] = pt_m.m_data[2];
        }
      }
    }
  }
  else if ((*(long *)(this + 0x10) == 0) && (this[0x20] != (ChBezierCurveTracker)0x1)) {
    iVar1 = -1;
  }
  else {
    ChBezierCurve::calcClosestPoint
              (&pt_m,*(ChBezierCurve **)this,loc,*(long *)(this + 0x10) - 1,&p_m);
    local_98._8_8_ = pt_m.m_data[1];
    local_98._0_8_ = pt_m.m_data[0];
    v.m_data._0_16_ = vsubpd_avx(local_98,*(undefined1 (*) [16])loc->m_data);
    v.m_data[2] = pt_m.m_data[2] - loc->m_data[2];
    dVar2 = ChVector<double>::Length2(&v);
    v_1.m_data._0_16_ =
         vsubpd_avx(*(undefined1 (*) [16])point->m_data,*(undefined1 (*) [16])loc->m_data);
    v_1.m_data[2] = point->m_data[2] - loc->m_data[2];
    dVar3 = ChVector<double>::Length2(&v_1);
    if (dVar2 < dVar3) {
      *(long *)(this + 0x10) = *(long *)(this + 0x10) + -1;
      *(double *)(this + 0x18) = p_m;
      point->m_data[0] = (double)local_98._0_8_;
      point->m_data[1] = (double)local_98._8_8_;
      point->m_data[2] = pt_m.m_data[2];
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int ChBezierCurveTracker::calcClosestPoint(const ChVector<>& loc, ChVector<>& point) {
    // Evaluate in current interval
    point = m_path->calcClosestPoint(loc, m_curInterval, m_curParam);

    if (m_curParam < ChBezierCurve::m_paramTol) {
        // Close to lower limit
        if ((m_curInterval == 0) && (!m_isClosedPath))
            return -1;

        // Check previous interval
        double p_m;
        auto pt_m = m_path->calcClosestPoint(loc, m_curInterval - 1, p_m);

        if ((pt_m - loc).Length2() < (point - loc).Length2()) {
            ////std::cout << "loc = " << loc << "  DECREASE to " << m_curInterval - 1 << "  p = " << p_m
            ////          << "    point: " << point << "  point minus: " << pt_m << std::endl;
            m_curInterval--;
            m_curParam = p_m;
            point = pt_m;
        }

        return 0;

    } else if (m_curParam > 1 - ChBezierCurve::m_paramTol) {
        // Close to upper limit
        if ((m_curInterval == m_path->getNumPoints() - 2) && (!m_isClosedPath))
            return +1;

        // Check next interval
        double p_p;
        auto pt_p = m_path->calcClosestPoint(loc, m_curInterval + 1, p_p);

        if ((pt_p - loc).Length2() < (point - loc).Length2()) {
            ////std::cout << "loc = " << loc << "  INCREASE to " << m_curInterval + 1 << "  p = " << p_p
            ////          << "    point: " << point << "  point plus: " << pt_p << std::endl;
            m_curInterval++;
            m_curParam = p_p;
            point = pt_p;
        }

        return 0;
    } else {
        // Not close to interval bounds. Done
        return 0;
    }
    
    /*
    bool lastAtMin = false;
    bool lastAtMax = false;

    while (true) {
        point = m_path->calcClosestPoint(loc, m_curInterval, m_curParam);

        if (m_curParam < ChBezierCurve::m_paramTol) {
            if ((m_curInterval == 0) && (!m_isClosedPath))
                return -1;

            if (lastAtMax)
                return 0;

            // If the search region is at the beginning of the interval check the 
            // previous interval.  Loop to the last interval if the path is a 
            // closed loop and is it is currently in the first interval
            if ((m_curInterval == 0) && (m_isClosedPath))
                m_curInterval = m_path->getNumPoints() - 2; 
            else
                m_curInterval--;

            lastAtMin = true;
            m_curParam = 1;
        } else if (m_curParam > 1 - ChBezierCurve::m_paramTol) {
            if ((m_curInterval == m_path->getNumPoints() - 2) && (!m_isClosedPath))
                return +1;

            if (lastAtMin)
                return 0;

            // If the search region is at the end of the interval check the 
            // next interval.  Loop to the first interval if the path is a 
            // closed loop and is it is currently in the last interval
            if ((m_curInterval == m_path->getNumPoints() - 2) && (m_isClosedPath))
                m_curInterval = 0;
            else
                m_curInterval++;

            lastAtMax = true;
            m_curParam = 0;
        } else
            return 0;
    }
    */
}